

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

char * transform_json2xml(lys_module *module,char *expr,char ***prefixes,char ***namespaces,
                         uint32_t *ns_count)

{
  char *pcVar1;
  
  pcVar1 = _transform_json2xml(module,expr,0,prefixes,namespaces,ns_count);
  return pcVar1;
}

Assistant:

static const char *
_transform_json2xml(const struct lys_module *module, const char *expr, int schema, const char ***prefixes,
                    const char ***namespaces, uint32_t *ns_count)
{
    const char *cur_expr, *end, *prefix, *ptr;
    char *out, *name;
    size_t out_size, out_used, name_len;
    const struct lys_module *mod = NULL;
    uint32_t i, j;
    struct lyxp_expr *exp;

    assert(module && expr && ((!prefixes && !namespaces && !ns_count) || (prefixes && namespaces && ns_count)));

    if (ns_count) {
        *ns_count = 0;
        *prefixes = NULL;
        *namespaces = NULL;
    }

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        LOGMEM;
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        free(out);
        return NULL;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            name_len = end - cur_expr;
            if (!schema) {
                name = strndup(cur_expr, name_len);
                mod = ly_ctx_get_module(module->ctx, name, NULL);
                free(name);
                if (!mod) {
                    LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, name_len, cur_expr);
                    goto error;
                }
                prefix = mod->prefix;
            } else {
                name = strndup(cur_expr, name_len);
                prefix = transform_module_name2import_prefix(module, name);
                free(name);
                if (!prefix) {
                    LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, name_len, cur_expr);
                    goto error;
                }
            }

            /* remember the namespace definition (only if it's new) */
            if (!schema && ns_count) {
                for (j = 0; j < *ns_count; ++j) {
                    if (ly_strequal((*namespaces)[j], mod->ns, 1)) {
                        break;
                    }
                }
                if (j == *ns_count) {
                    ++(*ns_count);
                    *prefixes = ly_realloc(*prefixes, *ns_count * sizeof **prefixes);
                    if (!(*prefixes)) {
                        LOGMEM;
                        goto error;
                    }
                    *namespaces = ly_realloc(*namespaces, *ns_count * sizeof **namespaces);
                    if (!(*namespaces)) {
                        LOGMEM;
                        goto error;
                    }
                    (*prefixes)[*ns_count - 1] = mod->prefix;
                    (*namespaces)[*ns_count - 1] = mod->ns;
                }
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(prefix) - name_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                LOGMEM;
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], prefix);
            out_used += strlen(prefix);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - name_len);
            out_used += exp->tok_len[i] - name_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            name_len = end - ptr;
            if (!schema) {
                prefix = NULL;
                name = strndup(ptr, name_len);
                mod = ly_ctx_get_module(module->ctx, name, NULL);
                free(name);
                if (mod) {
                    prefix = mod->prefix;
                }
            } else {
                name = strndup(ptr, name_len);
                prefix = transform_module_name2import_prefix(module, name);
                free(name);
            }

            if (prefix) {
                /* remember the namespace definition (only if it's new) */
                if (!schema && ns_count) {
                    for (j = 0; j < *ns_count; ++j) {
                        if (ly_strequal((*namespaces)[j], mod->ns, 1)) {
                            break;
                        }
                    }
                    if (j == *ns_count) {
                        ++(*ns_count);
                        *prefixes = ly_realloc(*prefixes, *ns_count * sizeof **prefixes);
                        if (!(*prefixes)) {
                            LOGMEM;
                            goto error;
                        }
                        *namespaces = ly_realloc(*namespaces, *ns_count * sizeof **namespaces);
                        if (!(*namespaces)) {
                            LOGMEM;
                            goto error;
                        }
                        (*prefixes)[*ns_count - 1] = mod->prefix;
                        (*namespaces)[*ns_count - 1] = mod->ns;
                    }
                }

                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(prefix) - name_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    LOGMEM;
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], prefix);
                out_used += strlen(prefix);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - name_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - name_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    if (!schema && ns_count) {
        free(*prefixes);
        free(*namespaces);
    }
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}